

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

void __thiscall dlib::string_cast_error::string_cast_error(string_cast_error *this,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"string cast error: invalid string = \'",str);
  std::operator+(&local_50,&local_30,"\'");
  error::error(&this->super_error,ESTRING_CAST,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_error = &PTR__error_001facf0;
  return;
}

Assistant:

string_cast_error(const std::string& str):
            error(ESTRING_CAST,"string cast error: invalid string = '" + str + "'") {}